

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O3

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::GenerateBlockSymbol>
          (ASTSerializer *this,GenerateBlockSymbol *elem,bool inMembersArray)

{
  char *__s;
  SourceManager *this_00;
  undefined8 in_RAX;
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  Symbol *member;
  Symbol *this_01;
  string_view sVar4;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar5;
  string_view name;
  string_view value;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  undefined1 auStack_38 [7];
  bool local_31;
  
  if ((elem->isUninstantiated == false) && ((elem->super_Symbol).kind != TransparentMember)) {
    _auStack_38 = in_RAX;
    JsonWriter::startObject(this->writer);
    sVar4 = (elem->super_Symbol).name;
    name._M_str = "name";
    name._M_len = 4;
    JsonWriter::writeProperty(this->writer,name);
    JsonWriter::writeValue(this->writer,sVar4);
    __s = *(char **)(toString(slang::ast::SymbolKind)::strings +
                    (long)(int)(elem->super_Symbol).kind * 8);
    sVar1 = strlen(__s);
    sVar4._M_str = "kind";
    sVar4._M_len = 4;
    JsonWriter::writeProperty(this->writer,sVar4);
    value._M_str = __s;
    value._M_len = sVar1;
    JsonWriter::writeValue(this->writer,value);
    if ((this->includeSourceInfo == true) &&
       (this_00 = this->compilation->sourceManager, this_00 != (SourceManager *)0x0)) {
      sVar4 = SourceManager::getFileName(this_00,(elem->super_Symbol).location);
      name_00._M_str = "source_file";
      name_00._M_len = 0xb;
      JsonWriter::writeProperty(this->writer,name_00);
      JsonWriter::writeValue(this->writer,sVar4);
      sVar2 = SourceManager::getLineNumber(this_00,(elem->super_Symbol).location);
      name_01._M_str = "source_line";
      name_01._M_len = 0xb;
      JsonWriter::writeProperty(this->writer,name_01);
      JsonWriter::writeValue(this->writer,sVar2);
      sVar2 = SourceManager::getColumnNumber(this_00,(elem->super_Symbol).location);
      name_02._M_str = "source_column";
      name_02._M_len = 0xd;
      JsonWriter::writeProperty(this->writer,name_02);
      JsonWriter::writeValue(this->writer,sVar2);
    }
    if (this->includeAddrs == true) {
      name_03._M_str = "addr";
      name_03._M_len = 4;
      JsonWriter::writeProperty(this->writer,name_03);
      JsonWriter::writeValue(this->writer,(uint64_t)elem);
    }
    sVar5 = Compilation::getAttributes(this->compilation,&elem->super_Symbol);
    if (sVar5._M_extent._M_extent_value._M_extent_value != 0) {
      name_04._M_str = "attributes";
      name_04._M_len = 10;
      JsonWriter::writeProperty(this->writer,name_04);
      JsonWriter::startArray(this->writer);
      lVar3 = 0;
      do {
        auStack_38 = (undefined1  [7])CONCAT16(0,auStack_38._0_6_);
        Symbol::visit<slang::ast::ASTSerializer&,bool&>
                  (*(Symbol **)((long)sVar5._M_ptr + lVar3),this,(bool *)(auStack_38 + 6));
        lVar3 = lVar3 + 8;
      } while (sVar5._M_extent._M_extent_value._M_extent_value << 3 != lVar3);
      JsonWriter::endArray(this->writer);
    }
    if ((elem->super_Scope).deferredMemberIndex != Invalid) {
      Scope::elaborate(&elem->super_Scope);
    }
    if ((elem->super_Scope).firstMember != (Symbol *)0x0) {
      name_05._M_str = "members";
      name_05._M_len = 7;
      JsonWriter::writeProperty(this->writer,name_05);
      JsonWriter::startArray(this->writer);
      if ((elem->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&elem->super_Scope);
      }
      this_01 = (elem->super_Scope).firstMember;
      if (this_01 != (Symbol *)0x0) {
        do {
          _auStack_38 = CONCAT17(1,auStack_38);
          Symbol::visit<slang::ast::ASTSerializer&,bool&>(this_01,this,(bool *)(auStack_38 + 7));
          this_01 = this_01->nextInScope;
        } while (this_01 != (Symbol *)0x0);
      }
      JsonWriter::endArray(this->writer);
    }
    GenerateBlockSymbol::serializeTo(elem,this);
    JsonWriter::endObject(this->writer);
  }
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}